

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrAllocExact(int nCap)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  
  if (-1 < nCap) {
    pVVar1 = (Vec_Ptr_t *)malloc(0x10);
    pVVar1->nSize = 0;
    pVVar1->nCap = nCap;
    if (nCap == 0) {
      ppvVar2 = (void **)0x0;
    }
    else {
      ppvVar2 = (void **)malloc((ulong)(uint)nCap << 3);
    }
    pVVar1->pArray = ppvVar2;
    return pVVar1;
  }
  __assert_fail("nCap >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocExact( int nCap )
{
    Vec_Ptr_t * p;
    assert( nCap >= 0 );
    p = ABC_ALLOC( Vec_Ptr_t, 1 );
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( void *, p->nCap ) : NULL;
    return p;
}